

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

int rottenfood(obj *obj)

{
  boolean bVar1;
  uint uVar2;
  uint uVar3;
  int tmp;
  char *pcVar4;
  int iVar5;
  int tmp_1;
  int iVar6;
  char *pcVar7;
  
  foodword(obj);
  pline("Blecch!  Rotten %s!");
  uVar2 = mt_random();
  if ((uVar2 & 3) == 0) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      body_part(10);
      pline("You feel rather %s.");
    }
    else {
      pline("You feel rather trippy.");
    }
    uVar2 = u.uprops[0x1c].intrinsic;
    iVar6 = 2;
    iVar5 = -2;
    do {
      uVar3 = mt_random();
      iVar6 = iVar6 + (uVar3 & 3);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    iVar5 = 0;
    make_confused((ulong)(iVar6 + uVar2),'\0');
  }
  else {
    uVar2 = mt_random();
    if (((uVar2 & 3) == 0) &&
       (((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      pline("Everything suddenly goes dark.");
      uVar2 = 2;
      iVar5 = -2;
      do {
        uVar3 = mt_random();
        uVar2 = uVar2 + uVar3 % 10;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
      iVar5 = 0;
      make_blinded((ulong)uVar2,'\0');
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        iVar5 = 0;
        pline("Your vision quickly clears.");
      }
    }
    else {
      uVar2 = mt_random();
      iVar5 = 0;
      if (uVar2 * -0x55555555 < 0x55555556) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pcVar7 = "dark";
          pcVar4 = "goes";
        }
        else {
          pcVar7 = "yourself";
          pcVar4 = "you lose control of";
          if (((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
              ((youmonst.data)->mlet != '\x05')) &&
             ((bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar1 == '\0' &&
              (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')))) {
            pcVar4 = "you slap against the";
            if (u.usteed == (monst *)0x0) {
              pcVar7 = surface((int)u.ux,(int)u.uy);
            }
            else {
              pcVar7 = "saddle";
            }
          }
        }
        pline("The world spins and %s %s.",pcVar4,pcVar7);
        flags.soundok = '\0';
        uVar2 = mt_random();
        nomul(~(uVar2 % 10),"unconscious from rotten food");
        nomovemsg = "You are conscious again.";
        afternmv = Hear_again;
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

static int rottenfood(struct obj *obj)
{
	pline("Blecch!  Rotten %s!", foodword(obj));
	if (!rn2(4)) {
		if (Hallucination) pline("You feel rather trippy.");
		else pline("You feel rather %s.", body_part(LIGHT_HEADED));
		make_confused(HConfusion + dice(2,4), FALSE);
	} else if (!rn2(4) && !Blind) {
		pline("Everything suddenly goes dark.");
		make_blinded((long)dice(2,10), FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	} else if (!rn2(3)) {
		const char *what, *where;
		if (!Blind)
		    what = "goes",  where = "dark";
		else if (Levitation || Is_airlevel(&u.uz) ||
			 Is_waterlevel(&u.uz))
		    what = "you lose control of",  where = "yourself";
		else
		    what = "you slap against the", where =
			   (u.usteed) ? "saddle" :
			   surface(u.ux,u.uy);
		pline("The world spins and %s %s.", what, where);
		flags.soundok = 0;
		nomul(-rnd(10), "unconscious from rotten food");
		nomovemsg = "You are conscious again.";
		afternmv = Hear_again;
		return 1;
	}
	return 0;
}